

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Layer *layer)

{
  uint32_t in_ECX;
  string local_30;
  
  tinyusdz::print_layer_abi_cxx11_(&local_30,(tinyusdz *)layer,(Layer *)0x0,in_ECX);
  std::operator<<(ofs,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Layer &layer) {
  ofs << to_string(layer);
  return ofs;
}